

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void failure_finish(void *extra)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  char *__path;
  void *unaff_RBX;
  wchar_t in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar4;
  
  if (extra != (void *)0x0) {
    uVar1 = archive_errno((archive *)extra);
    logprintf("    errno: %d\n",(ulong)uVar1);
    pcVar3 = archive_error_string((archive *)extra);
    in_ESI = (wchar_t)pcVar3;
    pcVar3 = "   detail: %s\n";
    logprintf("   detail: %s\n");
    unaff_RBX = extra;
    extra = pcVar3;
  }
  if (dump_on_failure == '\x01') {
    failure_finish_cold_1();
    assertions = assertions + L'\x01';
    msg = nextmsg;
    nextmsg = (char *)0x0;
    uVar4 = extraout_RAX;
    iVar2 = chdir(__path);
    if (iVar2 != 0) {
      failure_start((char *)extra,in_ESI,"chdir(\"%s\")",__path,in_R8,in_R9,uVar4,unaff_RBX);
      failure_finish((void *)0x0);
    }
    return;
  }
  return;
}

Assistant:

static void
failure_finish(void *extra)
{
	(void)extra; /* UNUSED (maybe) */
#ifdef EXTRA_DUMP
	if (extra != NULL) {
		logprintf("    errno: %d\n", EXTRA_ERRNO(extra));
		logprintf("   detail: %s\n", EXTRA_DUMP(extra));
	}
#endif

	if (dump_on_failure) {
		fprintf(stderr,
		    " *** forcing core dump so failure can be debugged ***\n");
		abort();
	}
}